

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilterindex.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_193474c::DBHeightKey::Unserialize<DataStream>(DBHeightKey *this,DataStream *s)

{
  long lVar1;
  uint8_t uVar2;
  uint32_t uVar3;
  error_code *this_00;
  uint32_t *in_RDI;
  long in_FS_OFFSET;
  uint8_t prefix;
  error_code *peVar4;
  DataStream *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = ser_readdata8<DataStream>(in_stack_ffffffffffffffb0);
  if (uVar2 == 't') {
    uVar3 = ser_readdata32be<DataStream>(in_stack_ffffffffffffffb0);
    *in_RDI = uVar3;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else {
    this_00 = (error_code *)__cxa_allocate_exception(0x20);
    peVar4 = this_00;
    std::error_code::error_code<std::io_errc,void>(this_00,(io_errc)((ulong)this_00 >> 0x20));
    std::ios_base::failure[abi:cxx11]::failure
              ((char *)peVar4,(error_code *)"Invalid format for coinstatsindex DB height key");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this_00,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        const uint8_t prefix{ser_readdata8(s)};
        if (prefix != DB_BLOCK_HEIGHT) {
            throw std::ios_base::failure("Invalid format for block filter index DB height key");
        }
        height = ser_readdata32be(s);
    }